

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_b7745::StringSorter::ApplyFilter
          (string *__return_storage_ptr__,StringSorter *this,string *argument)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_48;
  StringFilter *filter;
  StringFilter *__end2;
  StringFilter *__begin2;
  StringFilter (*__range2) [2];
  string *local_20;
  string *argument_local;
  StringSorter *this_local;
  string *result;
  
  __range2._7_1_ = 0;
  local_20 = argument;
  argument_local = (string *)this;
  this_local = (StringSorter *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)argument);
  filter = (StringFilter *)&this->SortMethod;
  __end2 = this->Filters;
  __begin2 = this->Filters;
  for (; __end2 != filter; __end2 = __end2 + 1) {
    local_48 = __end2;
    bVar1 = std::operator!=(__end2,(nullptr_t)0x0);
    if (bVar1) {
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&local_68,local_48,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ApplyFilter(const std::string& argument)
  {
    std::string result = argument;
    for (auto const& filter : this->Filters) {
      if (filter != nullptr) {
        result = filter(result);
      }
    }
    return result;
  }